

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void linenoiseEditDelete(linenoiseState *l)

{
  int iVar1;
  long in_RDI;
  int chlen;
  
  if ((*(long *)(in_RDI + 0x48) != 0) && (*(ulong *)(in_RDI + 0x38) < *(ulong *)(in_RDI + 0x48))) {
    iVar1 = (*(code *)nextCharLen)
                      (*(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x48),
                       *(undefined8 *)(in_RDI + 0x38),0);
    memmove((void *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x38)),
            (void *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x38) + (long)iVar1),
            (*(long *)(in_RDI + 0x48) - *(long *)(in_RDI + 0x38)) - (long)iVar1);
    *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) - (long)iVar1;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x48)) = 0;
    refreshLine((linenoiseState *)0x19c33b);
  }
  return;
}

Assistant:

static void linenoiseEditDelete(struct linenoiseState * l) {
    if (l->len > 0 && l->pos < l->len) {
        int chlen = nextCharLen(l->buf, l->len, l->pos, NULL);
        memmove(l->buf + l->pos, l->buf + l->pos + chlen, l->len - l->pos - chlen);
        l->len -= chlen;
        l->buf[l->len] = '\0';
        refreshLine(l);
    }
}